

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor-test.cc
# Opt level: O3

void __thiscall ExprVisitorTest_VisitAllDiff_Test::TestBody(ExprVisitorTest_VisitAllDiff_Test *this)

{
  StrictMock<MockVisitor> *this_00;
  bool bVar1;
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>
  value;
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  *this_01;
  MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)> *this_02;
  logic_error *this_03;
  char *message;
  FunctionMocker<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  *this_04;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  builder;
  AssertionResult gtest_ar;
  StrictMock<MockUnhandledVisitor> visitor;
  Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_> local_120;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8 [6];
  UntypedFunctionMockerBase local_98;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  local_30;
  
  local_108._0_8_ = (Impl *)0x0;
  std::
  vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>::
  emplace_back<mp::internal::ExprBase::Impl_const*>
            ((vector<mp::internal::ExprBase::Impl_const*,std::allocator<mp::internal::ExprBase::Impl_const*>>
              *)&(this->super_ExprVisitorTest).factory_.exprs_,(Impl **)local_108);
  local_30.impl_ = (Impl *)operator_new__(0x80);
  ((local_30.impl_)->super_Impl).kind_ = ALLDIFF;
  (this->super_ExprVisitorTest).factory_.exprs_.
  super__Vector_base<const_mp::internal::ExprBase::Impl_*,_std::allocator<const_mp::internal::ExprBase::Impl_*>_>
  ._M_impl.super__Vector_impl_data._M_finish[-1] = (Impl *)local_30.impl_;
  (local_30.impl_)->num_args = 1;
  local_30.arg_index_ = 0;
  mp::BasicExprFactory<std::allocator<char>_>::
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  ::AddArg(&local_30,
           (Arg)(this->super_ExprVisitorTest).var_.
                super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_);
  builder.arg_index_ = local_30.arg_index_;
  builder.impl_ = local_30.impl_;
  builder._12_4_ = 0;
  value = mp::BasicExprFactory<std::allocator<char>>::
          EndIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)68,(mp::expr::Kind)69>>
                    ((BasicExprFactory<std::allocator<char>> *)
                     &(this->super_ExprVisitorTest).factory_,builder);
  this_00 = &(this->super_ExprVisitorTest).visitor_;
  testing::
  Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
  ::Matcher((Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
             *)local_108,value);
  this_04 = &(this->super_ExprVisitorTest).visitor_.super_MockVisitor.gmock1_VisitAllDiff_159;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            ((UntypedFunctionMockerBase *)this_04,this_00);
  this_01 = testing::internal::
            FunctionMocker<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
            ::With(this_04,(Matcher<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>
                            *)local_108);
  testing::internal::
  MockSpec<TestResult_(mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>)>
  ::InternalExpectedAt
            (this_01,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x215,"visitor_","VisitAllDiff(e)");
  local_108._0_8_ = &PTR__MatcherBase_001e2968;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>_>
  ::~linked_ptr((linked_ptr<const_testing::MatcherInterface<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)68,_(mp::expr::Kind)69>_>_>
                 *)(local_108 + 8));
  mp::BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockVisitor,_TestResult,_mp::internal::ExprTypes> *)this_00,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.
                   impl_);
  testing::AssertionSuccess();
  if (local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>.
      _vptr_MatcherBase._0_1_ == true) {
    if (0x47 < *(uint *)value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase
                        .impl_) {
      this_03 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_03,"invalid expression kind");
      *(undefined ***)this_03 = &PTR__logic_error_001e2c88;
      __cxa_throw(this_03,&AssertionFailure::typeinfo,std::logic_error::~logic_error);
    }
    fmt::format<char_const*>
              ((string *)local_108,(fmt *)"unsupported: {}",(CStringRef)&stack0xfffffffffffffed8,
               (char **)mp::internal::ExprInfo::INFO);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      testing::Mock::FailUninterestingCalls(&stack0xfffffffffffffed8);
      mp::BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
                ((BasicExprVisitor<NullVisitor,_TestResult,_mp::internal::ExprTypes> *)
                 &stack0xfffffffffffffed8,
                 (Expr)value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.
                       impl_);
      testing::Mock::UnregisterCallReaction(&PTR__StrictMock_001e44f8);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)&local_120,
               (char (*) [127])
               "Expected: StrictMock<NullVisitor>().Visit(base) throws an exception of type mp::UnsupportedError.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ != local_f8) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_f8[0]._M_allocated_capacity + 1));
    }
  }
  testing::Message::Message((Message *)local_108);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>.impl_.
      value_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((_Alloc_hider *)
              &(local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>.
                impl_.value_)->super_MatcherDescriberInterface)->_M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&stack0xfffffffffffffed8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
             ,0x215,message);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&stack0xfffffffffffffed8,(Message *)local_108);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffed8);
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0)) {
    (**(code **)(*(size_type *)local_108._0_8_ + 8))();
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>.
            impl_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::StrictMock<MockUnhandledVisitor>::StrictMock
            ((StrictMock<MockUnhandledVisitor> *)local_108);
  testing::Matcher<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>::Matcher
            (&local_120,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)
             value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.impl_);
  testing::internal::UntypedFunctionMockerBase::RegisterOwner(&local_98,local_108);
  this_02 = testing::internal::
            FunctionMocker<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::With
                      ((FunctionMocker<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>
                        *)&local_98,&local_120);
  testing::internal::MockSpec<TestResult_(mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>)>::
  InternalExpectedAt(this_02,
                     "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-visitor-test.cc"
                     ,0x215,"visitor","VisitLogical(base)");
  local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>.
  _vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001e3aa0;
  testing::internal::
  linked_ptr<const_testing::MatcherInterface<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>_>
  ::~linked_ptr(&local_120.super_MatcherBase<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>_>
                 .impl_);
  mp::BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes>::Visit
            ((BasicExprVisitor<MockUnhandledVisitor,_TestResult,_mp::internal::ExprTypes> *)
             local_108,
             (Expr)value.super_BasicExpr<(mp::expr::Kind)68,_(mp::expr::Kind)69>.super_ExprBase.
                   impl_);
  testing::StrictMock<MockUnhandledVisitor>::~StrictMock
            ((StrictMock<MockUnhandledVisitor> *)local_108);
  return;
}

Assistant:

TEST_F(ExprVisitorTest, VisitStringLiteral) {
  auto e = factory_.MakeStringLiteral("foo");
  EXPECT_CALL(visitor_, VisitStringLiteral(e));
  mp::Expr base = e;
  visitor_.Visit(base);
  TEST_UNHANDLED(base);
}